

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

CBNode * __thiscall asmjit::CodeBuilder::addBefore(CodeBuilder *this,CBNode *node,CBNode *ref)

{
  CBNode *pCVar1;
  CBNode **ppCVar2;
  
  if (node == (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x14f,"node != nullptr");
  }
  if (node->_prev != (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x150,"node->_prev == nullptr");
  }
  if (node->_next != (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x151,"node->_next == nullptr");
  }
  if (ref != (CBNode *)0x0) {
    pCVar1 = ref->_prev;
    node->_prev = pCVar1;
    node->_next = ref;
    ref->_prev = node;
    ppCVar2 = &pCVar1->_next;
    if (pCVar1 == (CBNode *)0x0) {
      ppCVar2 = &this->_firstNode;
    }
    *ppCVar2 = node;
    return node;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
             ,0x152,"ref != nullptr");
}

Assistant:

CBNode* CodeBuilder::addBefore(CBNode* node, CBNode* ref) noexcept {
  ASMJIT_ASSERT(node != nullptr);
  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);
  ASMJIT_ASSERT(ref != nullptr);

  CBNode* prev = ref->_prev;
  CBNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}